

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassTemplate.h
# Opt level: O3

void __thiscall
kiste::ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp>::
render_member<kiste::class_t,kiste::member_t>
          (ClassTemplate_t<kiste::terminal_t,kiste::parse_context,kiste::cpp> *this,size_t line_no,
          class_t *class_data,member_t *member)

{
  pointer pcVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> class_alias;
  string unqualified_class_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  long *local_60;
  long local_58;
  long local_50 [2];
  size_t local_40;
  class_t *local_38;
  
  local_60 = local_50;
  pcVar1 = (member->class_name)._M_dataplus._M_p;
  local_40 = line_no;
  local_38 = class_data;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + (member->class_name)._M_string_length);
  do {
    uVar2 = std::__cxx11::string::find((char *)&local_60,0x10987f,0);
    if (uVar2 == 0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = "_";
      if (uVar2 == 0xffffffffffffffff) {
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_80,local_60,local_58 + (long)local_60,"_",1);
        std::__cxx11::string::append((char *)&local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10),"using ",6);
        cpp::
        escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  (*(cpp **)(this + 0x10),&local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10)," = ",3);
        cpp::
        escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  (*(cpp **)(this + 0x10),&member->class_name);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10),"_t<",3);
        cpp::
        escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  (*(cpp **)(this + 0x10),&local_38->_name);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10),"_t, _data_t, _serializer_t>;",0x1c);
        cpp::
        escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  (*(cpp **)(this + 0x10),&local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10)," ",1);
        cpp::
        escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  (*(cpp **)(this + 0x10),&member->name);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10)," = ",3);
        cpp::
        escape<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                  (*(cpp **)(this + 0x10),&local_80);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10),"{*this, data, _serialize};\n",0x1b);
        ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp>::line_directive
                  ((ClassTemplate_t<kiste::terminal_t,_kiste::parse_context,_kiste::cpp> *)this,
                   local_40 + 1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)**(undefined8 **)(this + 0x10),"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
        if (local_60 != local_50) {
          operator_delete(local_60,local_50[0] + 1);
        }
        return;
      }
    }
    std::__cxx11::string::replace((ulong)&local_60,uVar2,(char *)0x2,(ulong)pcVar3);
  } while( true );
}

Assistant:

void render_member(const size_t line_no, const ClassData& class_data, const Member& member)
    {
      // The "using" is required for clang-3.1 and older g++ versions.
      // Replace any namespace qualification by underscores for use in the alias type name.
      auto unqualified_class_name = member.class_name;
      {
        size_t ns_pos;
        while ((ns_pos = unqualified_class_name.find("::")) != std::string::npos)
          if (ns_pos == 0)
            unqualified_class_name.replace(ns_pos, 2, "");
          else
            unqualified_class_name.replace(ns_pos, 2, "_");
      }
      auto class_alias = unqualified_class_name + "_t_alias";
    _serialize.text("using ");_serialize.escape(class_alias);_serialize.text(" = ");_serialize.escape(member.class_name);_serialize.text("_t<");_serialize.escape(class_data._name);_serialize.text("_t, _data_t, _serializer_t>;");
    _serialize.escape(class_alias);_serialize.text(" ");_serialize.escape(member.name);_serialize.text(" = ");_serialize.escape(class_alias);_serialize.text("{*this, data, _serialize};\n");
    static_assert(std::is_same<decltype(line_directive(line_no + 1)), void>::value, "$call{} requires void expression"); (line_directive(line_no + 1));_serialize.text("\n");
    }